

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall smf::Options::setModified(Options *this,string *optionName,string *aString)

{
  int iVar1;
  
  iVar1 = getRegIndex(this,optionName);
  if (-1 < iVar1) {
    iVar1 = getRegIndex(this,optionName);
    Option_register::setModified
              ((this->m_optionRegister).
               super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar1],aString);
    return;
  }
  return;
}

Assistant:

void Options::setModified(const std::string& optionName,
		const std::string& aString) {
   int index = getRegIndex(optionName);
   if (index < 0) {
      return;
   }

   m_optionRegister[getRegIndex(optionName)]->setModified(aString);
}